

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_> *
__thiscall
capnp::compiler::Compiler::CompiledModule::getFileImportTable
          (Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
           *__return_storage_ptr__,CompiledModule *this,Orphanage orphanage)

{
  size_t sVar1;
  Reader decl;
  StringPtr importPath;
  bool bVar2;
  size_type sVar3;
  reference pSVar4;
  CompiledModule **ppCVar5;
  uint64_t value;
  ArrayPtr<const_char> local_198;
  CompiledModule *local_188;
  Fault local_180 [2];
  size_t sStack_170;
  Maybe<capnp::compiler::Compiler::CompiledModule_&> local_160;
  CompiledModule *local_158;
  CompiledModule *_kj_result;
  Builder entry;
  StringPtr name;
  _Self local_110;
  iterator __end2;
  iterator __begin2;
  set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *__range2;
  undefined1 local_f0 [4];
  uint i;
  BuilderFor<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
  builder;
  ReaderFor<capnp::compiler::ParsedFile> local_b8;
  Reader local_88;
  undefined1 local_58 [8];
  set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> importNames;
  CompiledModule *this_local;
  Orphanage orphanage_local;
  Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
  *result;
  
  orphanage_local.arena = (BuilderArena *)orphanage.capTable;
  this_local = (CompiledModule *)orphanage.arena;
  importNames._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  orphanage_local.capTable = (CapTableBuilder *)__return_storage_ptr__;
  std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::set
            ((set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *)
             local_58);
  Orphan<capnp::compiler::ParsedFile>::getReader(&local_b8,&this->content);
  ParsedFile::Reader::getRoot(&local_88,&local_b8);
  decl._reader.capTable = local_88._reader.capTable;
  decl._reader.segment = local_88._reader.segment;
  decl._reader.data = local_88._reader.data;
  decl._reader.pointers = local_88._reader.pointers;
  decl._reader.dataSize = local_88._reader.dataSize;
  decl._reader.pointerCount = local_88._reader.pointerCount;
  decl._reader._38_2_ = local_88._reader._38_2_;
  decl._reader.nestingLimit = local_88._reader.nestingLimit;
  decl._reader._44_4_ = local_88._reader._44_4_;
  findImports(decl,(set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *)
                   local_58);
  builder.builder.structDataSize._3_1_ = 0;
  sVar3 = std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::size
                    ((set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *
                     )local_58);
  Orphanage::
  newOrphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,(capnp::Kind)3>>
            (__return_storage_ptr__,(Orphanage *)&this_local,(uint)sVar3);
  Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>::
  get((BuilderFor<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
       *)local_f0,__return_storage_ptr__);
  __range2._4_4_ = 0;
  __end2 = std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::begin
                     ((set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
                       *)local_58);
  local_110._M_node =
       (_Base_ptr)
       std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::end
                 ((set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *)
                  local_58);
  while( true ) {
    bVar2 = std::operator!=(&__end2,&local_110);
    if (!bVar2) {
      builder.builder.structDataSize._3_1_ = 1;
      std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::~set
                ((set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *)
                 local_58);
      return __return_storage_ptr__;
    }
    pSVar4 = std::_Rb_tree_const_iterator<kj::StringPtr>::operator*(&__end2);
    entry._builder._32_8_ = (pSVar4->content).ptr;
    sVar1 = (pSVar4->content).size_;
    List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>::Builder::
    operator[]((Builder *)&_kj_result,(Builder *)local_f0,__range2._4_4_);
    local_180[1].exception = (Exception *)entry._builder._32_8_;
    importPath.content.size_ = sVar1;
    importPath.content.ptr = (char *)entry._builder._32_8_;
    sStack_170 = sVar1;
    local_160 = importRelative(this,importPath);
    local_158 = kj::_::readMaybe<capnp::compiler::Compiler::CompiledModule>(&local_160);
    if (local_158 == (CompiledModule *)0x0) break;
    ppCVar5 = kj::mv<capnp::compiler::Compiler::CompiledModule*>(&local_158);
    local_188 = *ppCVar5;
    value = Node::getId(&local_188->rootNode);
    capnp::schema::CodeGeneratorRequest::RequestedFile::Import::Builder::setId
              ((Builder *)&_kj_result,value);
    Text::Reader::Reader((Reader *)&local_198,(StringPtr *)&entry._builder.dataSize);
    capnp::schema::CodeGeneratorRequest::RequestedFile::Import::Builder::setName
              ((Builder *)&_kj_result,(Reader)local_198);
    std::_Rb_tree_const_iterator<kj::StringPtr>::operator++(&__end2);
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  kj::_::Debug::Fault::Fault
            (local_180,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x468,FAILED,"importRelative(name) != nullptr","");
  kj::_::Debug::Fault::fatal(local_180);
}

Assistant:

Orphan<List<schema::CodeGeneratorRequest::RequestedFile::Import>>
    Compiler::CompiledModule::getFileImportTable(Orphanage orphanage) {
  // Build a table of imports for CodeGeneratorRequest.RequestedFile.imports. Note that we only
  // care about type imports, not constant value imports, since constant values (including default
  // values) are already embedded in full in the schema. In other words, we only need the imports
  // that would need to be #included in the generated code.

  std::set<kj::StringPtr> importNames;
  findImports(content.getReader().getRoot(), importNames);

  auto result = orphanage.newOrphan<List<schema::CodeGeneratorRequest::RequestedFile::Import>>(
      importNames.size());
  auto builder = result.get();

  uint i = 0;
  for (auto name: importNames) {
    // We presumably ran this import before, so it shouldn't throw now.
    auto entry = builder[i++];
    entry.setId(KJ_ASSERT_NONNULL(importRelative(name)).rootNode.getId());
    entry.setName(name);
  }

  return result;
}